

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

amqp_rpc_reply_t *
simple_rpc_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                amqp_channel_t channel,amqp_method_number_t request_id,
                amqp_method_number_t *expected_reply_ids,void *decoded_request_method,
                amqp_time_t deadline)

{
  int iVar1;
  amqp_time_t deadline_00;
  amqp_pool_t *pool;
  undefined8 *puVar2;
  amqp_link_t *paVar3;
  amqp_response_type_enum aVar4;
  amqp_link_t *paVar5;
  amqp_method_number_t *paVar6;
  amqp_method_number_t aVar7;
  bool bVar8;
  amqp_frame_t frame;
  undefined4 uStack_7c;
  undefined4 local_78;
  amqp_frame_t local_60;
  
  deadline_00 = amqp_time_infinite();
  local_60.frame_type = '\x01';
  local_60.channel = channel;
  local_60.payload.method.id = request_id;
  local_60.payload.method.decoded = decoded_request_method;
  iVar1 = amqp_send_frame_inner(state,&local_60,0,deadline_00);
  if (iVar1 < 0) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar1;
    return __return_storage_ptr__;
  }
  while( true ) {
    iVar1 = wait_frame_inner(state,&local_60,deadline);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) {
        (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
      }
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      __return_storage_ptr__->library_error = iVar1;
      return __return_storage_ptr__;
    }
    if (local_60.frame_type == '\x01') break;
LAB_00103080:
    pool = amqp_get_or_create_channel_pool(state,local_60.channel);
    if (pool == (amqp_pool_t *)0x0) {
LAB_00103143:
      __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      __return_storage_ptr__->library_error = -1;
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)amqp_pool_alloc(pool,0x30);
    paVar3 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
    if ((puVar2 == (undefined8 *)0x0) || (paVar3 == (amqp_link_t *)0x0)) goto LAB_00103143;
    puVar2[4] = local_60.payload.properties.raw.len;
    puVar2[5] = local_60.payload.properties.raw.bytes;
    puVar2[2] = local_60.payload.method.decoded;
    puVar2[3] = local_60.payload.properties.decoded;
    *puVar2 = CONCAT44(local_60._4_4_,
                       CONCAT22(local_60.channel,CONCAT11(local_60._1_1_,local_60.frame_type)));
    puVar2[1] = CONCAT44(local_60.payload.body_fragment.len._4_4_,local_60.payload.method.id);
    paVar3->next = (amqp_link_t_ *)0x0;
    paVar3->data = puVar2;
    paVar5 = state->last_queued_frame;
    if (state->last_queued_frame == (amqp_link_t *)0x0) {
      paVar5 = (amqp_link_t *)&state->first_queued_frame;
    }
    paVar5->next = paVar3;
    state->last_queued_frame = paVar3;
  }
  if (local_60.channel == channel) {
    aVar7 = *expected_reply_ids;
    paVar6 = expected_reply_ids + 1;
    if (aVar7 == 0) {
      bVar8 = false;
    }
    else {
      do {
        bVar8 = aVar7 == local_60.payload.method.id;
        if (bVar8) break;
        aVar7 = *paVar6;
        paVar6 = paVar6 + 1;
      } while (aVar7 != 0);
    }
    if ((!bVar8) && (local_60.payload.method.id != 0x140028)) goto LAB_0010306d;
  }
  else {
LAB_0010306d:
    if ((local_60.channel != 0) || (local_60.payload.method.id != 0xa0032)) goto LAB_00103080;
  }
  aVar7 = *expected_reply_ids;
  aVar4 = AMQP_RESPONSE_SERVER_EXCEPTION;
  if (aVar7 != 0) {
    paVar6 = expected_reply_ids + 1;
    do {
      if (aVar7 == local_60.payload.method.id) {
        aVar4 = AMQP_RESPONSE_NORMAL;
        break;
      }
      aVar7 = *paVar6;
      paVar6 = paVar6 + 1;
    } while (aVar7 != 0);
  }
  uStack_7c = (undefined4)local_60.payload.properties.body_size;
  local_78 = (undefined4)((ulong)local_60.payload._8_8_ >> 0x20);
  __return_storage_ptr__->reply_type = aVar4;
  *(ulong *)&__return_storage_ptr__->field_0x4 = (ulong)local_60.payload.method.id << 0x20;
  *(ulong *)&(__return_storage_ptr__->reply).field_0x4 =
       CONCAT44(uStack_7c,local_60.payload.body_fragment.len._4_4_);
  *(undefined4 *)((long)&(__return_storage_ptr__->reply).decoded + 4) = local_78;
  *(undefined8 *)&__return_storage_ptr__->library_error = 0;
  return __return_storage_ptr__;
}

Assistant:

static amqp_rpc_reply_t simple_rpc_inner(
    amqp_connection_state_t state, amqp_channel_t channel,
    amqp_method_number_t request_id, amqp_method_number_t *expected_reply_ids,
    void *decoded_request_method, amqp_time_t deadline) {
  int status;
  amqp_rpc_reply_t result;

  memset(&result, 0, sizeof(result));

  status = amqp_send_method(state, channel, request_id, decoded_request_method);
  if (status < 0) {
    return amqp_rpc_reply_error(status);
  }

  {
    amqp_frame_t frame;

  retry:
    status = wait_frame_inner(state, &frame, deadline);
    if (status != AMQP_STATUS_OK) {
      if (status == AMQP_STATUS_TIMEOUT) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
      }
      return amqp_rpc_reply_error(status);
    }

    /*
     * We store the frame for later processing unless it's something
     * that directly affects us here, namely a method frame that is
     * either
     *  - on the channel we want, and of the expected type, or
     *  - on the channel we want, and a channel.close frame, or
     *  - on channel zero, and a connection.close frame.
     */
    if (!((frame.frame_type == AMQP_FRAME_METHOD) &&
          (((frame.channel == channel) &&
            (amqp_id_in_reply_list(frame.payload.method.id,
                                   expected_reply_ids) ||
             (frame.payload.method.id == AMQP_CHANNEL_CLOSE_METHOD))) ||
           ((frame.channel == 0) &&
            (frame.payload.method.id == AMQP_CONNECTION_CLOSE_METHOD))))) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;

      goto retry;
    }

    result.reply_type =
        (amqp_id_in_reply_list(frame.payload.method.id, expected_reply_ids))
            ? AMQP_RESPONSE_NORMAL
            : AMQP_RESPONSE_SERVER_EXCEPTION;

    result.reply = frame.payload.method;
    return result;
  }
}